

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O3

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_device_cache_property_flag_t val)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  string str;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  undefined1 *local_58;
  ulong local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  long *local_38 [2];
  long local_28 [2];
  
  local_50 = 0;
  local_48 = 0;
  local_58 = &local_48;
  if ((val == 0) || ((val & ZE_DEVICE_CACHE_PROPERTY_FLAG_USER_CONTROL) != 0)) {
    std::__cxx11::string::append((char *)&local_58);
  }
  if (local_50 < 4) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Device::{ ? }","");
  }
  else {
    std::__cxx11::string::substr((ulong)local_38,(ulong)&local_58);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x10b44f);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_68 = *plVar3;
      lStack_60 = plVar2[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar3;
      local_78 = (long *)*plVar2;
    }
    local_70 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_device_cache_property_flag_t val )
{
    const auto bits = static_cast<uint32_t>( val );

    std::string str;

    if( 0 == bits )
        str += "0 | ";
    
    if( static_cast<uint32_t>(ZE_DEVICE_CACHE_PROPERTY_FLAG_USER_CONTROL) & bits )
        str += "CACHE_PROPERTY_FLAG_USER_CONTROL | ";

    return ( str.size() > 3 ) 
        ? "Device::{ " + str.substr(0, str.size() - 3) + " }"
        : "Device::{ ? }";
}